

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
deqp::gles3::Functional::TransformFeedback::TransformFeedbackCase::runTest
          (TransformFeedbackCase *this,DrawCall *first,DrawCall *end,deUint32 seed)

{
  value_type vVar1;
  code *pcVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int height_00;
  deUint32 dVar9;
  int iVar10;
  DataType DVar11;
  undefined4 uVar12;
  TestLog *pTVar13;
  RenderContext *pRVar14;
  deUint32 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  reference pvVar15;
  size_type sVar16;
  reference pvVar17;
  reference pvVar18;
  undefined8 uVar19;
  pointer pAVar20;
  float *pfVar21;
  MessageBuilder *pMVar22;
  pointer pOVar23;
  reference output;
  bool local_f49;
  deUint32 local_e80;
  deUint32 local_d38;
  MessageBuilder local_ce0;
  MessageBuilder local_b60;
  RGBA local_9dc;
  PixelBufferAccess local_9d8;
  DrawCall *local_9b0;
  DrawCall *call_3;
  int offset_1;
  int local_974;
  undefined1 local_970 [4];
  int bufNdx_1;
  MessageBuilder local_7f0;
  MessageBuilder local_670;
  uint local_4f0;
  int local_4ec;
  deUint32 numPrimitives;
  deUint32 available_1;
  int expectedCount;
  bool mustBeReady;
  Output *local_360;
  _Alloc_hider *local_358;
  deUint8 *outputPtr;
  deUint8 *inputPtr;
  DrawCall *call_2;
  int outputOffset;
  int inputOffset;
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_330;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
  local_328;
  const_iterator out;
  void *bufPtr;
  int guardSize_1;
  int size_1;
  int stride_1;
  deUint32 buffer_1;
  int bufferNdx;
  MessageBuilder local_2f8;
  int local_174;
  DrawCall *pDStack_170;
  deUint32 available;
  DrawCall *call_1;
  undefined1 local_160 [3];
  bool tfEnabled;
  int offset;
  Vector<float,_4> local_150;
  Attribute *local_140;
  reference local_138;
  void *ptr;
  DataType local_128;
  int numComponents;
  DataType scalarType;
  int loc;
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  local_118;
  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
  local_110;
  const_iterator attrib;
  deUint32 usage;
  int guardSize;
  int size;
  int target;
  int stride;
  deUint32 buffer;
  int bufNdx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> inputData;
  DrawCall *call;
  undefined1 local_c0 [5];
  bool queryOk;
  bool imagesOk;
  bool outputsOk;
  Query primitiveQuery;
  Surface frameWithoutTf;
  Surface frameWithTf;
  int viewportY;
  int viewportX;
  int viewportH;
  int viewportW;
  int height;
  int local_50;
  int width;
  int numOutputs;
  int numInputs;
  Random rnd;
  Functions *gl;
  TestLog *log;
  deUint32 seed_local;
  DrawCall *end_local;
  DrawCall *first_local;
  TransformFeedbackCase *this_local;
  
  pTVar13 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
  rnd.m_rnd.z = (*pRVar14->_vptr_RenderContext[3])();
  rnd.m_rnd.w = extraout_var;
  de::Random::Random((Random *)&numOutputs,seed);
  width = 0;
  local_50 = 0;
  pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar6 = (*pRVar14->_vptr_RenderContext[4])();
  iVar6 = tcu::RenderTarget::getWidth((RenderTarget *)CONCAT44(extraout_var_00,iVar6));
  pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar7 = (*pRVar14->_vptr_RenderContext[4])();
  iVar7 = tcu::RenderTarget::getHeight((RenderTarget *)CONCAT44(extraout_var_01,iVar7));
  iVar8 = de::min<int>(0x80,iVar6);
  height_00 = de::min<int>(0x80,iVar7);
  iVar6 = de::Random::getInt((Random *)&numOutputs,0,iVar6 - iVar8);
  iVar7 = de::Random::getInt((Random *)&numOutputs,0,iVar7 - height_00);
  tcu::Surface::Surface((Surface *)&frameWithoutTf.m_pixels.m_cap,iVar8,height_00);
  tcu::Surface::Surface((Surface *)&primitiveQuery.super_ObjectWrapper.m_object,iVar8,height_00);
  pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)6> *)local_c0,pRVar14);
  bVar4 = true;
  call._5_1_ = true;
  for (inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage = (pointer)first;
      (DrawCall *)
      inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != end;
      inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 8) {
    width = *(int *)inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage + width;
    if ((inputData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage[4] & 1) == 0) {
      local_d38 = 0;
    }
    else {
      local_d38 = getTransformFeedbackOutputCount
                            (this->m_primitiveType,
                             *(int *)inputData.
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    local_50 = local_d38 + local_50;
  }
  iVar10 = this->m_inputStride;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)((long)&buffer + 3));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bufNdx,(long)(iVar10 * width)
             ,(allocator<unsigned_char> *)((long)&buffer + 3));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)((long)&buffer + 3));
  iVar10 = this->m_inputStride;
  pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bufNdx,0);
  genInputData(&this->m_attributes,width,iVar10,pvVar15,(Random *)&numOutputs);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xd0);
  dVar9 = glu::ObjectWrapper::get(&this->m_transformFeedback->super_ObjectWrapper);
  (*pcVar2)(0x8e22,dVar9);
  dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar9,"glBindTransformFeedback()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x449);
  for (stride = 0;
      sVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                         (&this->m_outputBuffers), stride < (int)sVar16; stride = stride + 1) {
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_outputBuffers,(long)stride);
    vVar1 = *pvVar17;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&this->m_bufferStrides,(long)stride);
    iVar10 = *pvVar18 * local_50;
    attrib._M_current._4_4_ = *pvVar18 * 2;
    attrib._M_current._0_4_ = 0x88e9;
    (**(code **)(rnd.m_rnd._8_8_ + 0x40))(0x8c8e,vVar1);
    (**(code **)(rnd.m_rnd._8_8_ + 0x150))(0x8c8e,(long)(iVar10 + attrib._M_current._4_4_),0,0x88e9)
    ;
    writeBufferGuard((Functions *)rnd.m_rnd._8_8_,0x8c8e,iVar10,attrib._M_current._4_4_);
    (**(code **)(rnd.m_rnd._8_8_ + 0x48))(0x8c8e,stride,vVar1);
    dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    glu::checkError(dVar9,"transform feedback buffer setup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x45c);
  }
  local_118._M_current =
       (Attribute *)
       std::
       vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
       ::begin(&this->m_attributes);
  __gnu_cxx::
  __normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>
  ::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute*>
            ((__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>>>
              *)&local_110,&local_118);
  while( true ) {
    _scalarType = std::
                  vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>
                  ::end(&this->m_attributes);
    bVar5 = __gnu_cxx::operator!=
                      (&local_110,
                       (__normal_iterator<deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
                        *)&scalarType);
    if (!bVar5) break;
    pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x780);
    dVar9 = glu::ShaderProgram::getProgram(this->m_program);
    __gnu_cxx::
    __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
    ::operator->(&local_110);
    uVar19 = std::__cxx11::string::c_str();
    numComponents = (*pcVar2)(dVar9,uVar19);
    pAVar20 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
              ::operator->(&local_110);
    DVar11 = glu::VarType::getBasicType(&pAVar20->type);
    local_128 = glu::getDataTypeScalarType(DVar11);
    pAVar20 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
              ::operator->(&local_110);
    DVar11 = glu::VarType::getBasicType(&pAVar20->type);
    ptr._4_4_ = glu::getDataTypeScalarSize(DVar11);
    pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bufNdx,0);
    pAVar20 = __gnu_cxx::
              __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
              ::operator->(&local_110);
    local_138 = pvVar15 + pAVar20->offset;
    if (-1 < numComponents) {
      (**(code **)(rnd.m_rnd._8_8_ + 0x610))(numComponents);
      if (local_128 == TYPE_FLOAT) {
        (**(code **)(rnd.m_rnd._8_8_ + 0x19f0))
                  (numComponents,ptr._4_4_,0x1406,0,this->m_inputStride,local_138);
      }
      else if (local_128 == TYPE_INT) {
        (**(code **)(rnd.m_rnd._8_8_ + 0x1958))
                  (numComponents,ptr._4_4_,0x1404,this->m_inputStride,local_138);
      }
      else if (local_128 == TYPE_UINT) {
        (**(code **)(rnd.m_rnd._8_8_ + 0x1958))
                  (numComponents,ptr._4_4_,0x1405,this->m_inputStride,local_138);
      }
    }
    local_140 = (Attribute *)
                __gnu_cxx::
                __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Attribute_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Attribute,_std::allocator<deqp::gles3::Functional::TransformFeedback::Attribute>_>_>
                ::operator++(&local_110,0);
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x1a00))(iVar6,iVar7,iVar8,height_00);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x1680);
  dVar9 = glu::ShaderProgram::getProgram(this->m_program);
  (*pcVar2)(dVar9);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x15a8);
  pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar9 = glu::ShaderProgram::getProgram(this->m_program);
  uVar12 = (*pcVar3)(dVar9,"u_scale");
  tcu::Vector<float,_4>::Vector(&local_150,0.01);
  pfVar21 = tcu::Vector<float,_4>::getPtr(&local_150);
  (*pcVar2)(uVar12,1,pfVar21);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x15a8);
  pcVar3 = *(code **)(rnd.m_rnd._8_8_ + 0xb48);
  dVar9 = glu::ShaderProgram::getProgram(this->m_program);
  uVar12 = (*pcVar3)(dVar9,"u_bias");
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_160,0.5);
  pfVar21 = tcu::Vector<float,_4>::getPtr((Vector<float,_4> *)local_160);
  (*pcVar2)(uVar12,1,pfVar21);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x20);
  dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_c0);
  (*pcVar2)(0x8c88,dVar9);
  dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar9,"glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x47c);
  call_1._4_4_ = 0;
  call_1._3_1_ = 1;
  (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4000);
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0x30);
  dVar9 = getTransformFeedbackPrimitiveMode(this->m_primitiveType);
  (*pcVar2)(dVar9);
  for (pDStack_170 = first; pDStack_170 != end; pDStack_170 = pDStack_170 + 1) {
    if ((pDStack_170->transformFeedbackEnabled & 1U) != (call_1._3_1_ & 1)) {
      if ((pDStack_170->transformFeedbackEnabled & 1U) == 0) {
        (**(code **)(rnd.m_rnd._8_8_ + 0xfe0))();
      }
      else {
        (**(code **)(rnd.m_rnd._8_8_ + 0x1248))();
      }
      call_1._3_1_ = pDStack_170->transformFeedbackEnabled & 1;
    }
    (**(code **)(rnd.m_rnd._8_8_ + 0x538))
              (this->m_primitiveType,call_1._4_4_,pDStack_170->numElements);
    call_1._4_4_ = pDStack_170->numElements + call_1._4_4_;
  }
  if ((call_1._3_1_ & 1) == 0) {
    (**(code **)(rnd.m_rnd._8_8_ + 0x1248))();
  }
  (**(code **)(rnd.m_rnd._8_8_ + 0x638))();
  dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar9,"render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x49c);
  (**(code **)(rnd.m_rnd._8_8_ + 0x628))(0x8c88);
  dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar9,"glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a0);
  local_174 = 0;
  pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xa20);
  dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_c0);
  (*pcVar2)(dVar9,0x8867,&local_174);
  dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
  glu::checkError(dVar9,"glGetQueryObjectuiv()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                  ,0x4a6);
  tcu::TestLog::operator<<(&local_2f8,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar22 = tcu::MessageBuilder::operator<<
                      (&local_2f8,
                       (char (*) [63])
                       "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: ");
  _buffer_1 = "GL_FALSE";
  if (local_174 != 0) {
    _buffer_1 = "GL_TRUE";
  }
  pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,(char **)&buffer_1);
  tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_2f8);
  stride_1 = 0;
  do {
    sVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_outputBuffers);
    if ((int)sVar16 <= stride_1) {
      bVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        (&this->m_outputBuffers);
      available_1._3_1_ = !bVar5;
      numPrimitives = computeTransformFeedbackPrimitiveCount(this->m_primitiveType,first,end);
      local_4ec = 0;
      local_4f0 = 0;
      pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xa20);
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_c0);
      (*pcVar2)(dVar9,0x8867,&local_4ec);
      pcVar2 = *(code **)(rnd.m_rnd._8_8_ + 0xa20);
      dVar9 = glu::ObjectWrapper::operator*((ObjectWrapper *)local_c0);
      (*pcVar2)(dVar9,0x8866,&local_4f0);
      dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
      glu::checkError(dVar9,"glGetQueryObjectuiv()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x4e9);
      if (((available_1._3_1_ & 1) == 0) && (local_4ec == 0)) {
        tcu::TestLog::operator<<(&local_670,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar22 = tcu::MessageBuilder::operator<<
                            (&local_670,
                             (char (*) [92])
                             "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!"
                            );
        tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_670);
        call._5_1_ = false;
      }
      tcu::TestLog::operator<<(&local_7f0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
      pMVar22 = tcu::MessageBuilder::operator<<
                          (&local_7f0,(char (*) [44])"GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = ");
      pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,&local_4f0);
      tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder(&local_7f0);
      if (local_4f0 != numPrimitives) {
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_970,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar22 = tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)local_970,(char (*) [17])0x12a1f6d);
        pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,(int *)&numPrimitives);
        pMVar22 = tcu::MessageBuilder::operator<<(pMVar22,(char (*) [13])" primitives!");
        tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_970);
        call._5_1_ = false;
      }
      (**(code **)(rnd.m_rnd._8_8_ + 0xd0))(0x8e22,0);
      for (local_974 = 0; iVar8 = local_974,
          sVar16 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             (&this->m_outputBuffers), iVar8 < (int)sVar16;
          local_974 = local_974 + 1) {
        (**(code **)(rnd.m_rnd._8_8_ + 0x40))(0x8c8e,0);
        (**(code **)(rnd.m_rnd._8_8_ + 0x48))(0x8c8e,local_974,0);
      }
      pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
      tcu::Surface::getAccess
                ((PixelBufferAccess *)&stack0xfffffffffffff660,
                 (Surface *)&frameWithoutTf.m_pixels.m_cap);
      glu::readPixels(pRVar14,iVar6,iVar7,(PixelBufferAccess *)&stack0xfffffffffffff660);
      call_3._4_4_ = 0;
      (**(code **)(rnd.m_rnd._8_8_ + 0x188))(0x4000);
      for (local_9b0 = first; local_9b0 != end; local_9b0 = local_9b0 + 1) {
        (**(code **)(rnd.m_rnd._8_8_ + 0x538))
                  (this->m_primitiveType,call_3._4_4_,local_9b0->numElements);
        call_3._4_4_ = local_9b0->numElements + call_3._4_4_;
      }
      dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
      glu::checkError(dVar9,"render",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                      ,0x511);
      pRVar14 = Context::getRenderContext((this->super_TestCase).m_context);
      tcu::Surface::getAccess(&local_9d8,(Surface *)&primitiveQuery.super_ObjectWrapper.m_object);
      glu::readPixels(pRVar14,iVar6,iVar7,&local_9d8);
      tcu::RGBA::RGBA(&local_9dc,1,1,1,1);
      bVar5 = tcu::pixelThresholdCompare
                        (pTVar13,"Result","Image comparison result",
                         (Surface *)&primitiveQuery.super_ObjectWrapper.m_object,
                         (Surface *)&frameWithoutTf.m_pixels.m_cap,&local_9dc,COMPARE_LOG_ON_ERROR);
      if (bVar5) {
        pTVar13 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_b60,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar22 = tcu::MessageBuilder::operator<<
                            (&local_b60,
                             (char (*) [71])
                             "Rendering result comparison between TF enabled and TF disabled passed."
                            );
        tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_b60);
      }
      else {
        pTVar13 = tcu::TestContext::getLog
                            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_ce0,pTVar13,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar22 = tcu::MessageBuilder::operator<<
                            (&local_ce0,
                             (char (*) [78])
                             "ERROR: Rendering result comparison between TF enabled and TF disabled failed!"
                            );
        tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_ce0);
      }
      local_f49 = false;
      if ((bVar4) && (local_f49 = false, bVar5)) {
        local_f49 = call._5_1_;
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bufNdx);
      glu::TypedObjectWrapper<(glu::ObjectType)6>::~TypedObjectWrapper
                ((TypedObjectWrapper<(glu::ObjectType)6> *)local_c0);
      tcu::Surface::~Surface((Surface *)&primitiveQuery.super_ObjectWrapper.m_object);
      tcu::Surface::~Surface((Surface *)&frameWithoutTf.m_pixels.m_cap);
      de::Random::~Random((Random *)&numOutputs);
      return local_f49;
    }
    pvVar17 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->m_outputBuffers,(long)stride_1);
    vVar1 = *pvVar17;
    pvVar18 = std::vector<int,_std::allocator<int>_>::operator[]
                        (&this->m_bufferStrides,(long)stride_1);
    iVar8 = *pvVar18;
    out._M_current = (Output *)0x0;
    (**(code **)(rnd.m_rnd._8_8_ + 0x40))(0x8c8e,vVar1);
    out._M_current =
         (Output *)
         (**(code **)(rnd.m_rnd._8_8_ + 0xd00))(0x8c8e,0,(long)(iVar8 * local_50 + iVar8 * 2),1);
    dVar9 = (**(code **)(rnd.m_rnd._8_8_ + 0x800))();
    glu::checkError(dVar9,"mapping buffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTransformFeedbackTests.cpp"
                    ,0x4b7);
    local_330._M_current =
         (Output *)
         std::
         vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
         ::begin(&this->m_transformFeedbackOutputs);
    __gnu_cxx::
    __normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Output,std::allocator<deqp::gles3::Functional::TransformFeedback::Output>>>
    ::__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output*>
              ((__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_const*,std::vector<deqp::gles3::Functional::TransformFeedback::Output,std::allocator<deqp::gles3::Functional::TransformFeedback::Output>>>
                *)&local_328,&local_330);
    while( true ) {
      _outputOffset =
           std::
           vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>
           ::end(&this->m_transformFeedbackOutputs);
      bVar5 = __gnu_cxx::operator!=
                        (&local_328,
                         (__normal_iterator<deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
                          *)&outputOffset);
      if (!bVar5) break;
      pOVar23 = __gnu_cxx::
                __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
                ::operator->(&local_328);
      if (pOVar23->bufferNdx == stride_1) {
        call_2._4_4_ = 0;
        call_2._0_4_ = 0;
        for (inputPtr = (deUint8 *)first; (DrawCall *)inputPtr != end; inputPtr = inputPtr + 8) {
          if ((inputPtr[4] & 1) != 0) {
            pvVar15 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&bufNdx,0)
            ;
            outputPtr = pvVar15 + call_2._4_4_ * this->m_inputStride;
            local_358 = &((out._M_current)->name)._M_dataplus + (int)call_2 * iVar8;
            dVar9 = this->m_primitiveType;
            output = __gnu_cxx::
                     __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
                     ::operator*(&local_328);
            bVar5 = compareTransformFeedbackOutput
                              (pTVar13,dVar9,output,*(int *)inputPtr,outputPtr,this->m_inputStride,
                               (deUint8 *)local_358,iVar8);
            if (!bVar5) {
              bVar4 = false;
              break;
            }
          }
          call_2._4_4_ = *(int *)inputPtr + call_2._4_4_;
          if ((inputPtr[4] & 1) == 0) {
            local_e80 = 0;
          }
          else {
            local_e80 = getTransformFeedbackOutputCount(this->m_primitiveType,*(int *)inputPtr);
          }
          call_2._0_4_ = local_e80 + (int)call_2;
        }
      }
      local_360 = (Output *)
                  __gnu_cxx::
                  __normal_iterator<const_deqp::gles3::Functional::TransformFeedback::Output_*,_std::vector<deqp::gles3::Functional::TransformFeedback::Output,_std::allocator<deqp::gles3::Functional::TransformFeedback::Output>_>_>
                  ::operator++(&local_328,0);
    }
    bVar5 = verifyGuard((deUint8 *)(&((out._M_current)->name)._M_dataplus + iVar8 * local_50),
                        iVar8 * 2);
    if (!bVar5) {
      tcu::TestLog::operator<<
                ((MessageBuilder *)&expectedCount,pTVar13,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar22 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&expectedCount,
                           (char (*) [50])"Error: Transform feedback buffer overrun detected");
      tcu::MessageBuilder::operator<<(pMVar22,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&expectedCount);
      bVar4 = false;
    }
    (**(code **)(rnd.m_rnd._8_8_ + 0x1670))(0x8c8e);
    stride_1 = stride_1 + 1;
  } while( true );
}

Assistant:

bool TransformFeedbackCase::runTest (const DrawCall* first, const DrawCall* end, deUint32 seed)
{
	TestLog&				log				= m_testCtx.getLog();
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	de::Random				rnd				(seed);
	int						numInputs		= 0;		//!< Sum of element counts in calls.
	int						numOutputs		= 0;		//!< Sum of output counts for calls that have transform feedback enabled.
	int						width			= m_context.getRenderContext().getRenderTarget().getWidth();
	int						height			= m_context.getRenderContext().getRenderTarget().getHeight();
	int						viewportW		= de::min((int)VIEWPORT_WIDTH, width);
	int						viewportH		= de::min((int)VIEWPORT_HEIGHT, height);
	int						viewportX		= rnd.getInt(0, width-viewportW);
	int						viewportY		= rnd.getInt(0, height-viewportH);
	tcu::Surface			frameWithTf		(viewportW, viewportH);
	tcu::Surface			frameWithoutTf	(viewportW, viewportH);
	glu::Query				primitiveQuery	(m_context.getRenderContext());
	bool					outputsOk		= true;
	bool					imagesOk		= true;
	bool					queryOk			= true;

	// Compute totals.
	for (const DrawCall* call = first; call != end; call++)
	{
		numInputs	+= call->numElements;
		numOutputs	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
	}

	// Input data.
	vector<deUint8> inputData(m_inputStride*numInputs);
	genInputData(m_attributes, numInputs, m_inputStride, &inputData[0], rnd);

	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, m_transformFeedback->get());
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTransformFeedback()");

	// Allocate storage for transform feedback output buffers and bind to targets.
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufNdx];
		int				stride		= m_bufferStrides[bufNdx];
		int				target		= bufNdx;
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const deUint32	usage		= GL_DYNAMIC_READ;

		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, size+guardSize, DE_NULL, usage);
		writeBufferGuard(gl, GL_TRANSFORM_FEEDBACK_BUFFER, size, guardSize);

		// \todo [2012-07-30 pyry] glBindBufferRange()?
		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, target, buffer);

		GLU_EXPECT_NO_ERROR(gl.getError(), "transform feedback buffer setup");
	}

	// Setup attributes.
	for (vector<Attribute>::const_iterator attrib = m_attributes.begin(); attrib != m_attributes.end(); attrib++)
	{
		int				loc				= gl.getAttribLocation(m_program->getProgram(), attrib->name.c_str());
		glu::DataType	scalarType		= glu::getDataTypeScalarType(attrib->type.getBasicType());
		int				numComponents	= glu::getDataTypeScalarSize(attrib->type.getBasicType());
		const void*		ptr				= &inputData[0] + attrib->offset;

		if (loc >= 0)
		{
			gl.enableVertexAttribArray(loc);

			if (scalarType == glu::TYPE_FLOAT)		gl.vertexAttribPointer	(loc, numComponents, GL_FLOAT, GL_FALSE, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_INT)	gl.vertexAttribIPointer	(loc, numComponents, GL_INT, m_inputStride, ptr);
			else if (scalarType == glu::TYPE_UINT)	gl.vertexAttribIPointer	(loc, numComponents, GL_UNSIGNED_INT, m_inputStride, ptr);
		}
	}

	// Setup viewport.
	gl.viewport(viewportX, viewportY, viewportW, viewportH);

	// Setup program.
	gl.useProgram(m_program->getProgram());

	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_scale"),	1, tcu::Vec4(0.01f).getPtr());
	gl.uniform4fv(gl.getUniformLocation(m_program->getProgram(), "u_bias"),		1, tcu::Vec4(0.5f).getPtr());

	// Enable query.
	gl.beginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN, *primitiveQuery);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Draw.
	{
		int		offset		= 0;
		bool	tfEnabled	= true;

		gl.clear(GL_COLOR_BUFFER_BIT);

		gl.beginTransformFeedback(getTransformFeedbackPrimitiveMode(m_primitiveType));

		for (const DrawCall* call = first; call != end; call++)
		{
			// Pause or resume transform feedback if necessary.
			if (call->transformFeedbackEnabled != tfEnabled)
			{
				if (call->transformFeedbackEnabled)
					gl.resumeTransformFeedback();
				else
					gl.pauseTransformFeedback();
				tfEnabled = call->transformFeedbackEnabled;
			}

			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		// Resume feedback before finishing it.
		if (!tfEnabled)
			gl.resumeTransformFeedback();

		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
	}

	gl.endQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndQuery(GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN)");

	// Check and log query status right after submit
	{
		deUint32 available = GL_FALSE;
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN status after submit: " << (available != GL_FALSE ? "GL_TRUE" : "GL_FALSE") << TestLog::EndMessage;
	}

	// Compare result buffers.
	for (int bufferNdx = 0; bufferNdx < (int)m_outputBuffers.size(); bufferNdx++)
	{
		deUint32		buffer		= m_outputBuffers[bufferNdx];
		int				stride		= m_bufferStrides[bufferNdx];
		int				size		= stride*numOutputs;
		int				guardSize	= stride*BUFFER_GUARD_MULTIPLIER;
		const void*		bufPtr		= DE_NULL;

		// Bind buffer for reading.
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, buffer);
		bufPtr = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, size+guardSize, GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "mapping buffer");

		// Verify all output variables that are written to this buffer.
		for (vector<Output>::const_iterator out = m_transformFeedbackOutputs.begin(); out != m_transformFeedbackOutputs.end(); out++)
		{
			if (out->bufferNdx != bufferNdx)
				continue;

			int inputOffset		= 0;
			int	outputOffset	= 0;

			// Process all draw calls and check ones with transform feedback enabled.
			for (const DrawCall* call = first; call != end; call++)
			{
				if (call->transformFeedbackEnabled)
				{
					const deUint8*	inputPtr	= &inputData[0] + inputOffset*m_inputStride;
					const deUint8*	outputPtr	= (const deUint8*)bufPtr + outputOffset*stride;

					if (!compareTransformFeedbackOutput(log, m_primitiveType, *out, call->numElements, inputPtr, m_inputStride, outputPtr, stride))
					{
						outputsOk = false;
						break;
					}
				}

				inputOffset		+= call->numElements;
				outputOffset	+= call->transformFeedbackEnabled ? getTransformFeedbackOutputCount(m_primitiveType, call->numElements) : 0;
			}
		}

		// Verify guardband.
		if (!verifyGuard((const deUint8*)bufPtr + size, guardSize))
		{
			log << TestLog::Message << "Error: Transform feedback buffer overrun detected" << TestLog::EndMessage;
			outputsOk = false;
		}

		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	}

	// Check status after mapping buffers.
	{
		const bool	mustBeReady		= !m_outputBuffers.empty(); // Mapping buffer forces synchronization.
		const int	expectedCount	= computeTransformFeedbackPrimitiveCount(m_primitiveType, first, end);
		deUint32	available		= GL_FALSE;
		deUint32	numPrimitives	= 0;

		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT_AVAILABLE, &available);
		gl.getQueryObjectuiv(*primitiveQuery, GL_QUERY_RESULT, &numPrimitives);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv()");

		if (!mustBeReady && available == GL_FALSE)
		{
			log << TestLog::Message << "ERROR: GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN result not available after mapping buffers!" << TestLog::EndMessage;
			queryOk = false;
		}

		log << TestLog::Message << "GL_TRANSFORM_FEEDBACK_PRIMITIVES_WRITTEN = " << numPrimitives << TestLog::EndMessage;

		if ((int)numPrimitives != expectedCount)
		{
			log << TestLog::Message << "ERROR: Expected " << expectedCount << " primitives!" << TestLog::EndMessage;
			queryOk = false;
		}
	}

	// Clear transform feedback state.
	gl.bindTransformFeedback(GL_TRANSFORM_FEEDBACK, 0);
	for (int bufNdx = 0; bufNdx < (int)m_outputBuffers.size(); bufNdx++)
	{
		gl.bindBuffer		(GL_TRANSFORM_FEEDBACK_BUFFER, 0);
		gl.bindBufferBase	(GL_TRANSFORM_FEEDBACK_BUFFER, bufNdx, 0);
	}

	// Read back rendered image.
	glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithTf.getAccess());

	// Render without transform feedback.
	{
		int offset = 0;

		gl.clear(GL_COLOR_BUFFER_BIT);

		for (const DrawCall* call = first; call != end; call++)
		{
			gl.drawArrays(m_primitiveType, offset, call->numElements);
			offset += call->numElements;
		}

		GLU_EXPECT_NO_ERROR(gl.getError(), "render");
		glu::readPixels(m_context.getRenderContext(), viewportX, viewportY, frameWithoutTf.getAccess());
	}

	// Compare images with and without transform feedback.
	imagesOk = tcu::pixelThresholdCompare(log, "Result", "Image comparison result", frameWithoutTf, frameWithTf, tcu::RGBA(1, 1, 1, 1), tcu::COMPARE_LOG_ON_ERROR);

	if (imagesOk)
		m_testCtx.getLog() << TestLog::Message << "Rendering result comparison between TF enabled and TF disabled passed." << TestLog::EndMessage;
	else
		m_testCtx.getLog() << TestLog::Message << "ERROR: Rendering result comparison between TF enabled and TF disabled failed!" << TestLog::EndMessage;

	return outputsOk && imagesOk && queryOk;
}